

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.c
# Opt level: O0

void do_call(int *ip)

{
  int iVar1;
  ushort **ppuVar2;
  t_proc *ptVar3;
  int local_1c;
  int value;
  t_proc *ptr;
  int *ip_local;
  
  labldef(loccnt,1);
  data_loccnt = loccnt;
  loccnt = loccnt + 3;
  if (pass == 1) {
    while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)prlnbuf[*ip]] & 0x2000) != 0) {
      *ip = *ip + 1;
    }
    iVar1 = colsym(ip);
    if (iVar1 == 0) {
      if (symbol[0] == '\0') {
        fatal_error("Syntax error!");
      }
    }
    else {
      check_eol(ip);
      ptVar3 = proc_look();
      if (ptVar3 == (t_proc *)0x0) {
        lablptr = stlook(0);
        if (lablptr == (t_symbol *)0x0) {
          fatal_error("Undefined destination!");
          return;
        }
        local_1c = lablptr->value;
      }
      else if (bank == ptVar3->bank) {
        local_1c = ptVar3->org + 0xa000;
      }
      else if (ptVar3->call == 0) {
        local_1c = call_ptr + 0x8000;
        ptVar3->call = local_1c;
        iVar1 = call_ptr;
        if (call_ptr == 0) {
          max_bank = max_bank + 1;
          call_bank = max_bank;
        }
        call_ptr = call_ptr + 1;
        poke(iVar1,0xa8);
        iVar1 = call_ptr;
        call_ptr = call_ptr + 1;
        poke(iVar1,0x43);
        iVar1 = call_ptr;
        call_ptr = call_ptr + 1;
        poke(iVar1,0x20);
        iVar1 = call_ptr;
        call_ptr = call_ptr + 1;
        poke(iVar1,0x48);
        iVar1 = call_ptr;
        call_ptr = call_ptr + 1;
        poke(iVar1,0xa9);
        iVar1 = call_ptr;
        call_ptr = call_ptr + 1;
        poke(iVar1,ptVar3->bank + bank_base);
        iVar1 = call_ptr;
        call_ptr = call_ptr + 1;
        poke(iVar1,0x53);
        iVar1 = call_ptr;
        call_ptr = call_ptr + 1;
        poke(iVar1,0x20);
        iVar1 = call_ptr;
        call_ptr = call_ptr + 1;
        poke(iVar1,0x98);
        iVar1 = call_ptr;
        call_ptr = call_ptr + 1;
        poke(iVar1,0x20);
        iVar1 = call_ptr;
        call_ptr = call_ptr + 1;
        poke(iVar1,ptVar3->org & 0xff);
        iVar1 = call_ptr;
        call_ptr = call_ptr + 1;
        poke(iVar1,(ptVar3->org >> 8) + 0xa0);
        iVar1 = call_ptr;
        call_ptr = call_ptr + 1;
        poke(iVar1,0xa8);
        iVar1 = call_ptr;
        call_ptr = call_ptr + 1;
        poke(iVar1,0x68);
        iVar1 = call_ptr;
        call_ptr = call_ptr + 1;
        poke(iVar1,0x53);
        iVar1 = call_ptr;
        call_ptr = call_ptr + 1;
        poke(iVar1,0x20);
        iVar1 = call_ptr;
        call_ptr = call_ptr + 1;
        poke(iVar1,0x98);
        iVar1 = call_ptr;
        call_ptr = call_ptr + 1;
        poke(iVar1,0x60);
      }
      else {
        local_1c = ptVar3->call;
      }
      putbyte(data_loccnt,0x20);
      putword(data_loccnt + 1,local_1c);
      println();
    }
  }
  return;
}

Assistant:

void
do_call(int *ip)
{
	struct t_proc *ptr;
	int value;

	/* define label */
	labldef(loccnt, 1);

	/* update location counter */
	data_loccnt = loccnt;
	loccnt += 3;

	/* generate code */
	if (pass == LAST_PASS) {
		/* skip spaces */
		while (isspace(prlnbuf[*ip]))
			(*ip)++;

		/* extract name */
		if (!colsym(ip)) {
			if (symbol[0] == 0)
				fatal_error("Syntax error!");
			return;
		}

		/* check end of line */
		check_eol(ip);

		/* lookup proc table */
		if((ptr = proc_look())) {
			/* check banks */
			if (bank == ptr->bank)
				value = ptr->org + 0xA000;
			else {
				/* different */
				if (ptr->call)
					value = ptr->call;
				else {
					/* new call */
					value = call_ptr + 0x8000;
					ptr->call = value;

					/* init */
					if (call_ptr == 0) {
						call_bank = ++max_bank;
					}

					/* install */
					poke(call_ptr++, 0xA8);			// tay
					poke(call_ptr++, 0x43);			// tma #5
					poke(call_ptr++, 0x20);
					poke(call_ptr++, 0x48);			// pha
					poke(call_ptr++, 0xA9);			// lda #...
					poke(call_ptr++, ptr->bank+bank_base);
					poke(call_ptr++, 0x53);			// tam #5
					poke(call_ptr++, 0x20);
					poke(call_ptr++, 0x98);			// tya
					poke(call_ptr++, 0x20);			// jsr ...
					poke(call_ptr++, (ptr->org & 0xFF));
					poke(call_ptr++, (ptr->org >> 8) + 0xA0);
					poke(call_ptr++, 0xA8);			// tay
					poke(call_ptr++, 0x68);			// pla
					poke(call_ptr++, 0x53);			// tam #5
					poke(call_ptr++, 0x20);
					poke(call_ptr++, 0x98);			// tya
					poke(call_ptr++, 0x60);			// rts
				}
			}
		}
		else {
			/* lookup symbol table */
			if ((lablptr = stlook(0)) == NULL) {
				fatal_error("Undefined destination!");
				return;
			}

			/* get symbol value */
			value = lablptr->value;
		}

		/* opcode */
		putbyte(data_loccnt, 0x20);
		putword(data_loccnt+1, value);

		/* output line */
		println();
	}
}